

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
CDBWrapper::ReadImpl_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CDBWrapper *this,Span<const_std::byte> key)

{
  undefined8 *puVar1;
  DB *pDVar2;
  bool bVar3;
  unique_ptr<LevelDBContext,_std::default_delete<LevelDBContext>_> *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  Status status;
  Slice slKey;
  string strValue;
  Status in_stack_ffffffffffffff80;
  string local_68;
  undefined1 *local_48;
  size_type local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  long local_28;
  
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)key.m_data;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  puVar4 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  pDVar2 = ((puVar4->_M_t).
            super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
            super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
            super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->pdb;
  puVar4 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (*pDVar2->_vptr_DB[5])
            (&stack0xffffffffffffff80,pDVar2,
             &((puVar4->_M_t).
               super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
               super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
               super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->readoptions,
             &stack0xffffffffffffff88,&local_48);
  if (in_stack_ffffffffffffff80.state_ != (char *)0x0) {
    if (in_stack_ffffffffffffff80.state_[4] == '\x01') {
      bVar3 = false;
      goto LAB_0046d3a5;
    }
    leveldb::Status::ToString_abi_cxx11_(&local_68,(Status *)&stack0xffffffffffffff80);
    logging_function._M_str = "ReadImpl";
    logging_function._M_len = 8;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
    source_file._M_len = 0x56;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function,source_file,0x15a,
               IPC|COINDB|MEMPOOLREJ|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|ZMQ|BENCH|HTTP|TOR,
               (Level)&local_68,in_stack_ffffffffffffff80.state_,args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    HandleError((Status *)&stack0xffffffffffffff80);
  }
  puVar1 = (undefined8 *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x10);
  *(undefined8 **)
   &(__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload = puVar1;
  if (local_48 == &local_38) {
    *puVar1 = CONCAT71(uStack_37,local_38);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload + 0x18) = uStack_30;
  }
  else {
    *(undefined1 **)
     &(__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload = local_48;
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 0x10) = CONCAT71(uStack_37,local_38);
  }
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = local_40;
  local_40 = 0;
  local_38 = 0;
  bVar3 = true;
  local_48 = &local_38;
LAB_0046d3a5:
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = bVar3;
  if (in_stack_ffffffffffffff80.state_ != (char *)0x0) {
    operator_delete__(in_stack_ffffffffffffff80.state_);
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> CDBWrapper::ReadImpl(Span<const std::byte> key) const
{
    leveldb::Slice slKey(CharCast(key.data()), key.size());
    std::string strValue;
    leveldb::Status status = DBContext().pdb->Get(DBContext().readoptions, slKey, &strValue);
    if (!status.ok()) {
        if (status.IsNotFound())
            return std::nullopt;
        LogPrintf("LevelDB read failure: %s\n", status.ToString());
        HandleError(status);
    }
    return strValue;
}